

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O0

void cfg_help_netaddr(autobuf *out,_Bool preamble,_Bool prefix,int8_t *af_types,
                     size_t af_types_count)

{
  char cVar1;
  bool bVar2;
  ulong local_38;
  size_t i;
  _Bool first;
  int8_t type;
  size_t af_types_count_local;
  int8_t *af_types_local;
  _Bool prefix_local;
  _Bool preamble_local;
  autobuf *out_local;
  
  if (preamble) {
    abuf_puts(out,"    Parameter must be an address of the following type: ");
  }
  bVar2 = true;
  for (local_38 = 0; local_38 < af_types_count; local_38 = local_38 + 1) {
    cVar1 = af_types[local_38];
    if (cVar1 != -1) {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        abuf_puts(out,", ");
      }
      if (cVar1 == '\x02') {
        abuf_puts(out,"IPv4");
      }
      else if (cVar1 == '\n') {
        abuf_puts(out,"IPv6");
      }
      else if (cVar1 == '/') {
        abuf_puts(out,"MAC48");
      }
      else if (cVar1 == '0') {
        abuf_puts(out,"EUI64");
      }
      else {
        abuf_puts(out,"Unspec (-)");
      }
    }
  }
  if (prefix) {
    abuf_puts(out,"\n        (the address can have an optional prefix)");
  }
  abuf_puts(out,"\n");
  return;
}

Assistant:

void
cfg_help_netaddr(struct autobuf *out, bool preamble, bool prefix, const int8_t *af_types, size_t af_types_count) {
  int8_t type;
  bool first;
  size_t i;

  if (preamble) {
    abuf_puts(out, CFG_HELP_INDENT_PREFIX "Parameter must be an address of the following type: ");
  }

  first = true;
  for (i = 0; i < af_types_count; i++) {
    type = af_types[i];

    if (type == -1) {
      continue;
    }

    if (first) {
      first = false;
    }
    else {
      abuf_puts(out, ", ");
    }

    switch (type) {
      case AF_INET:
        abuf_puts(out, "IPv4");
        break;
      case AF_INET6:
        abuf_puts(out, "IPv6");
        break;
      case AF_MAC48:
        abuf_puts(out, "MAC48");
        break;
      case AF_EUI64:
        abuf_puts(out, "EUI64");
        break;
      default:
        abuf_puts(out, "Unspec (-)");
        break;
    }
  }

  if (prefix) {
    abuf_puts(out, "\n" CFG_HELP_INDENT_PREFIX "    (the address can have an optional prefix)");
  }
  abuf_puts(out, "\n");
}